

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O1

void __thiscall
google::protobuf::internal::SooRep::set_non_soo
          (SooRep *this,bool was_soo,int capacity,void *elements)

{
  ulong uVar1;
  Nonnull<const_char_*> pcVar2;
  
  uVar1 = (this->field_0).long_rep.elements_int;
  if (((uVar1 & 4) == 0) == was_soo) {
    pcVar2 = (Nonnull<const_char_*>)0x0;
  }
  else {
    pcVar2 = absl::lts_20250127::log_internal::MakeCheckOpString<bool,bool>
                       (was_soo,(uVar1 & 4) == 0,"was_soo == is_soo()");
  }
  if (pcVar2 == (Nonnull<const_char_*>)0x0) {
    if (elements == (void *)0x0) {
      pcVar2 = absl::lts_20250127::log_internal::MakeCheckOpString<void_const*,void_const*>
                         ((void *)0x0,(void *)0x0,"elements != nullptr");
    }
    else {
      pcVar2 = (Nonnull<const_char_*>)0x0;
    }
    if (pcVar2 == (Nonnull<const_char_*>)0x0) {
      if (((ulong)elements & 7) == 0) {
        pcVar2 = (Nonnull<const_char_*>)0x0;
      }
      else {
        pcVar2 = absl::lts_20250127::log_internal::MakeCheckOpString<unsigned_long,unsigned_long>
                           ((ulong)elements & 7,0,
                            "reinterpret_cast<uintptr_t>(elements) % kSooPtrAlignment == uintptr_t{0}"
                           );
      }
      if (pcVar2 == (Nonnull<const_char_*>)0x0) {
        if (was_soo) {
          (this->field_0).long_rep.size = *(uint *)&this->field_0 & 3;
        }
        (this->field_0).long_rep.capacity = capacity;
        (this->field_0).long_rep.elements_int = (ulong)elements | 4;
        return;
      }
      goto LAB_001a33aa;
    }
  }
  else {
    set_non_soo();
  }
  set_non_soo();
LAB_001a33aa:
  set_non_soo();
}

Assistant:

void set_non_soo(bool was_soo, int capacity, void* elements) {
    ABSL_DCHECK_EQ(was_soo, is_soo());
    ABSL_DCHECK_NE(elements, nullptr);
    ABSL_DCHECK_EQ(reinterpret_cast<uintptr_t>(elements) % kSooPtrAlignment,
                   uintptr_t{0});
    if (was_soo) long_rep.size = short_rep.size();
    long_rep.capacity = capacity;
    long_rep.elements_int = reinterpret_cast<uintptr_t>(elements) | kNotSooBit;
  }